

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polevl.c
# Opt level: O0

double hcephes_p1evl(double x,double *coef,int N)

{
  int local_34;
  double *pdStack_30;
  int i;
  double *p;
  double ans;
  int N_local;
  double *coef_local;
  double x_local;
  
  p = (double *)(x + *coef);
  local_34 = N + -1;
  pdStack_30 = coef + 1;
  do {
    p = (double *)((double)p * x + *pdStack_30);
    local_34 = local_34 + -1;
    pdStack_30 = pdStack_30 + 1;
  } while (local_34 != 0);
  return (double)p;
}

Assistant:

HCEPHES_API double hcephes_p1evl(double x, double coef[], int N) {
    double ans;
    double *p;
    int i;

    p = coef;
    ans = x + *p++;
    i = N - 1;

    do
        ans = ans * x + *p++;
    while (--i);

    return ans;
}